

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::make_string<Explicit>(lest *this,Explicit *item)

{
  string local_1c8 [52];
  int local_194;
  ostringstream local_190 [8];
  ostringstream os;
  Explicit *item_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = item->x;
  ::operator<<((ostream *)local_190,(Explicit)local_194);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}